

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm.cpp
# Opt level: O0

int __thiscall ncnn::GroupNorm::forward_inplace(GroupNorm *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float *pfVar2;
  long in_RSI;
  long in_RDI;
  double dVar3;
  int i_2;
  float *ptr_2;
  float beta;
  float gamma;
  float b;
  float a;
  int q_2;
  float var;
  float tmp;
  int i_1;
  float *ptr_1;
  int q_1;
  float sqsum;
  float mean;
  int i;
  float *ptr;
  int q;
  float sum;
  Mat bottom_top_blob_g;
  int g;
  int channels_per_group;
  int size;
  int h;
  int w;
  float *in_stack_fffffffffffffe30;
  Mat *in_stack_fffffffffffffe38;
  int local_1b4;
  Mat local_1b0;
  float *local_168;
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  int local_150;
  float local_14c;
  float local_148;
  int local_144;
  Mat local_140;
  float *local_f8;
  int local_ec;
  float local_e8;
  float local_e4;
  int local_e0;
  Mat local_d0;
  Mat *local_88;
  int local_80;
  float local_7c;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = local_1c * local_20;
  local_28 = *(int *)(in_RDI + 0xd4) / *(int *)(in_RDI + 0xd0);
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0xd0); local_2c = local_2c + 1) {
    ncnn::Mat::channel_range
              (in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20),
               (int)in_stack_fffffffffffffe30);
    local_7c = 0.0;
    for (local_80 = 0; local_80 < local_28; local_80 = local_80 + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
      in_stack_fffffffffffffe38 = (Mat *)ncnn::Mat::operator_cast_to_float_(&local_d0);
      ncnn::Mat::~Mat((Mat *)0x906572);
      for (local_e0 = 0; local_e0 < local_24; local_e0 = local_e0 + 1) {
        local_7c = *(float *)((long)&in_stack_fffffffffffffe38->data + (long)local_e0 * 4) +
                   local_7c;
      }
      local_88 = in_stack_fffffffffffffe38;
    }
    local_e4 = local_7c / (float)(local_28 * local_24);
    local_e8 = 0.0;
    for (local_ec = 0; local_ec < local_28; local_ec = local_ec + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
      in_stack_fffffffffffffe30 = ncnn::Mat::operator_cast_to_float_(&local_140);
      ncnn::Mat::~Mat((Mat *)0x9066be);
      for (local_144 = 0; local_144 < local_24; local_144 = local_144 + 1) {
        local_148 = in_stack_fffffffffffffe30[local_144] - local_e4;
        local_e8 = local_148 * local_148 + local_e8;
      }
      local_f8 = in_stack_fffffffffffffe30;
    }
    local_14c = local_e8 / (float)(local_28 * local_24);
    for (local_150 = 0; local_150 < local_28; local_150 = local_150 + 1) {
      if (*(int *)(in_RDI + 0xdc) == 0) {
        dVar3 = std::sqrt((double)(ulong)(uint)(local_14c + *(float *)(in_RDI + 0xd8)));
        local_154 = 1.0 / SUB84(dVar3,0);
        local_158 = -local_e4 * local_154;
      }
      else {
        pfVar2 = ncnn::Mat::operator[]
                           ((Mat *)(in_RDI + 0xe0),(long)(local_2c * local_28 + local_150));
        local_15c = *pfVar2;
        pfVar2 = ncnn::Mat::operator[]
                           ((Mat *)(in_RDI + 0x128),(long)(local_2c * local_28 + local_150));
        fVar1 = local_15c;
        local_160 = *pfVar2;
        dVar3 = std::sqrt((double)(ulong)(uint)(local_14c + *(float *)(in_RDI + 0xd8)));
        local_154 = fVar1 / SUB84(dVar3,0);
        local_158 = -local_e4 * local_154 + local_160;
      }
      ncnn::Mat::channel(in_stack_fffffffffffffe38,(int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
      pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_1b0);
      ncnn::Mat::~Mat((Mat *)0x90698f);
      for (local_1b4 = 0; local_1b4 < local_24; local_1b4 = local_1b4 + 1) {
        pfVar2[local_1b4] = pfVar2[local_1b4] * local_154 + local_158;
      }
      local_168 = pfVar2;
    }
    ncnn::Mat::~Mat((Mat *)0x906a38);
  }
  return 0;
}

Assistant:

int GroupNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / sqrt(var + eps) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int size = w * h;

    int channels_per_group = channels / group;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);

        // mean and var
        float sum = 0.f;
        for (int q = 0; q < channels_per_group; q++)
        {
            const float* ptr = bottom_top_blob_g.channel(q);
            for (int i = 0; i < size; i++)
            {
                sum += ptr[i];
            }
        }
        float mean = sum / (channels_per_group * size);

        float sqsum = 0.f;
        for (int q = 0; q < channels_per_group; q++)
        {
            const float* ptr = bottom_top_blob_g.channel(q);
            for (int i = 0; i < size; i++)
            {
                float tmp = ptr[i] - mean;
                sqsum += tmp * tmp;
            }
        }
        float var = sqsum / (channels_per_group * size);

        for (int q = 0; q < channels_per_group; q++)
        {
            float a;
            float b;
            if (affine)
            {
                float gamma = gamma_data[g * channels_per_group + q];
                float beta = beta_data[g * channels_per_group + q];

                a = static_cast<float>(gamma / sqrt(var + eps));
                b = -mean * a + beta;
            }
            else
            {
                a = static_cast<float>(1.f / (sqrt(var + eps)));
                b = -mean * a;
            }

            float* ptr = bottom_top_blob_g.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = ptr[i] * a + b;
            }
        }
    }

    return 0;
}